

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueTemplate.h
# Opt level: O1

bool __thiscall
L15_2::
QueueTemplate<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
dequeue(QueueTemplate<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i)

{
  Node *pNVar1;
  pointer pcVar2;
  Node *pNVar3;
  
  pNVar1 = this->_first;
  if (pNVar1 != (Node *)0x0) {
    this->_size = this->_size + -1;
    pcVar2 = (pNVar1->item)._M_dataplus._M_p;
    pNVar3 = pNVar1->next;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pNVar1->item).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pNVar1);
    this->_first = pNVar3;
    if (this->_size == 0) {
      this->_last = (Node *)0x0;
    }
  }
  return pNVar1 != (Node *)0x0;
}

Assistant:

bool QueueTemplate<T>::dequeue(T &i) {  //  still quite confused why this "T & i" is needed...
        if (_first == nullptr) {
            return false;
        }
        _size--;
        Node * f = _first->next;
        delete _first;
        _first = f;
        if (_size == 0) {
            _last = nullptr;
        }
        return true;
    }